

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O0

void __thiscall
btKinematicCharacterController::preStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld)

{
  bool bVar1;
  btTransform *this_00;
  btVector3 *pbVar2;
  long in_RDI;
  undefined4 uVar3;
  btVector3 bVar4;
  double platformVelocityResponseAlpha;
  int numPenetrationLoops;
  btCollisionWorld *in_stack_00000118;
  btKinematicCharacterController *in_stack_00000120;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  btVector3 *in_stack_ffffffffffffffb0;
  undefined8 local_30;
  undefined8 local_28;
  int local_14;
  
  local_14 = 0;
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xe4) = *(undefined8 *)(in_RDI + 0xd4);
  *(undefined8 *)(in_RDI + 0xec) = *(undefined8 *)(in_RDI + 0xdc);
  do {
    bVar1 = recoverFromPenetration(in_stack_00000120,in_stack_00000118);
    if (!bVar1) break;
    local_14 = local_14 + 1;
    *(undefined1 *)(in_RDI + 0xb0) = 1;
  } while (local_14 < 5);
  ::operator*(in_stack_ffffffffffffffb0,
              (btScalar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar3 = 0x3f800000;
  bVar4 = ::operator*(in_stack_ffffffffffffffb0,
                      (btScalar *)CONCAT44(in_stack_ffffffffffffffac,0x3f800000));
  bVar4 = operator+(bVar4.m_floats._4_8_,(btVector3 *)CONCAT44(bVar4.m_floats[0],uVar3));
  local_30 = bVar4.m_floats._0_8_;
  *(undefined8 *)(in_RDI + 0xd4) = local_30;
  local_28 = bVar4.m_floats._8_8_;
  *(undefined8 *)(in_RDI + 0xdc) = local_28;
  this_00 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 0x10));
  pbVar2 = btTransform::getOrigin(this_00);
  *(undefined8 *)(in_RDI + 0x6c) = *(undefined8 *)pbVar2->m_floats;
  *(undefined8 *)(in_RDI + 0x74) = *(undefined8 *)(pbVar2->m_floats + 2);
  *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(in_RDI + 0x6c);
  *(undefined8 *)(in_RDI + 0x88) = *(undefined8 *)(in_RDI + 0x74);
  return;
}

Assistant:

void btKinematicCharacterController::preStep (  btCollisionWorld* collisionWorld)
{

	int numPenetrationLoops = 0;
	m_touchingContact = false;
	m_newPlatformLinearVelocity = m_platformLinearVelocity;

	while (recoverFromPenetration (collisionWorld))
	{
		numPenetrationLoops++;
		m_touchingContact = true;
		if (numPenetrationLoops > 4)
		{
			//printf("character could not recover from penetration = %d\n", numPenetrationLoops);
			break;
		}
	}

	auto platformVelocityResponseAlpha = 1.0;
	m_platformLinearVelocity = m_platformLinearVelocity*(1.0f - platformVelocityResponseAlpha) + m_newPlatformLinearVelocity*platformVelocityResponseAlpha;

	m_currentPosition = m_ghostObject->getWorldTransform().getOrigin();
	m_targetPosition = m_currentPosition;
//	printf("m_targetPosition=%f,%f,%f\n",m_targetPosition[0],m_targetPosition[1],m_targetPosition[2]);


}